

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_prediction_degree_traverser.h
# Opt level: O2

CornerIndex __thiscall
draco::
MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::PopNextCornerToTraverse
          (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this)

{
  uint uVar1;
  pointer pIVar2;
  long lVar3;
  pointer *ppIVar4;
  
  lVar3 = (long)this->best_priority_;
  ppIVar4 = &this->traversal_stacks_[lVar3].
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (2 < lVar3) {
      return (CornerIndex)0xffffffff;
    }
    pIVar2 = *ppIVar4;
    if (((_Vector_impl_data *)(ppIVar4 + -1))->_M_start != pIVar2) break;
    lVar3 = lVar3 + 1;
    ppIVar4 = ppIVar4 + 3;
  }
  uVar1 = pIVar2[-1].value_;
  *ppIVar4 = pIVar2 + -1;
  this->best_priority_ = (int)lVar3;
  return (CornerIndex)uVar1;
}

Assistant:

CornerIndex PopNextCornerToTraverse() {
    for (int i = best_priority_; i < kMaxPriority; ++i) {
      if (!traversal_stacks_[i].empty()) {
        const CornerIndex ret = traversal_stacks_[i].back();
        traversal_stacks_[i].pop_back();
        best_priority_ = i;
        return ret;
      }
    }
    return kInvalidCornerIndex;
  }